

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SensorManager.cpp
# Opt level: O2

void __thiscall sf::priv::SensorManager::~SensorManager(SensorManager *this)

{
  SensorImpl *this_00;
  int in_ESI;
  long lVar1;
  bool bVar2;
  
  this_00 = (SensorImpl *)&this->m_sensors[0].field_0x2;
  lVar1 = 6;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    if (this_00[-2] == (SensorImpl)0x1) {
      this = (SensorManager *)this_00;
      SensorImpl::close(this_00,in_ESI);
    }
    this_00 = this_00 + 0x10;
  }
  SensorImpl::cleanup((EVP_PKEY_CTX *)this);
  return;
}

Assistant:

SensorManager::~SensorManager()
{
    // Per sensor cleanup
    for (int i = 0; i < Sensor::Count; ++i)
    {
        if (m_sensors[i].available)
            m_sensors[i].sensor.close();
    }

    // Global sensor cleanup
    SensorImpl::cleanup();
}